

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

GLSLstd450 __thiscall
spirv_cross::CompilerGLSL::get_remapped_glsl_op(CompilerGLSL *this,GLSLstd450 std450_op)

{
  GLSLstd450 local_14;
  GLSLstd450 std450_op_local;
  CompilerGLSL *this_local;
  
  local_14 = std450_op;
  if (((this->options).relax_nan_checks & 1U) != 0) {
    if (std450_op == GLSLstd450NMin) {
      local_14 = GLSLstd450FMin;
    }
    else if (std450_op == GLSLstd450NMax) {
      local_14 = GLSLstd450FMax;
    }
    else if (std450_op == GLSLstd450NClamp) {
      local_14 = GLSLstd450FClamp;
    }
  }
  return local_14;
}

Assistant:

GLSLstd450 CompilerGLSL::get_remapped_glsl_op(GLSLstd450 std450_op) const
{
	// Relax to non-NaN aware opcodes.
	if (options.relax_nan_checks)
	{
		switch (std450_op)
		{
		case GLSLstd450NClamp:
			std450_op = GLSLstd450FClamp;
			break;
		case GLSLstd450NMin:
			std450_op = GLSLstd450FMin;
			break;
		case GLSLstd450NMax:
			std450_op = GLSLstd450FMax;
			break;
		default:
			break;
		}
	}

	return std450_op;
}